

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

uint8_t * sysbvm_jit_installIn
                    (sysbvm_bytecodeJit_t *jit,uint8_t *codeWriteablePointer,
                    uint8_t *codeExecutablePointer)

{
  uint8_t *puVar1;
  size_t __n;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  size_t i;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint8_t *puVar11;
  ulong uVar12;
  uint8_t *baseAddress;
  long lVar13;
  long lVar14;
  long lVar15;
  uint8_t *ehFrameZoneExecutablePointer;
  
  __n = (jit->objectFileHeader).size;
  uVar12 = __n + 0xf & 0xfffffffffffffff0;
  lVar13 = ((jit->instructions).size + 0xf & 0xfffffffffffffff0) + uVar12;
  lVar8 = ((jit->constants).size + 0xf & 0xfffffffffffffff0) + lVar13;
  lVar6 = ((jit->unwindInfo).size + 0xf & 0xfffffffffffffff0) + lVar8;
  lVar9 = ((jit->dwarfEhBuilder).buffer.size + 0xf & 0xfffffffffffffff0) + lVar6;
  sVar2 = (jit->dwarfDebugInfoBuilder).line.size;
  sVar3 = (jit->dwarfDebugInfoBuilder).str.size;
  sVar4 = (jit->dwarfDebugInfoBuilder).abbrev.size;
  sVar5 = (jit->dwarfDebugInfoBuilder).info.size;
  memcpy(codeWriteablePointer,(jit->objectFileHeader).data,__n);
  puVar1 = codeWriteablePointer + uVar12;
  baseAddress = codeExecutablePointer + uVar12;
  memcpy(puVar1,(jit->instructions).data,(jit->instructions).size);
  memcpy(codeWriteablePointer + lVar13,(jit->constants).data,(jit->constants).size);
  lVar7 = 0x18;
  for (uVar10 = 0; uVar10 < (jit->relocations).size; uVar10 = uVar10 + 1) {
    puVar11 = (jit->relocations).data;
    lVar14 = *(long *)(puVar11 + lVar7 + -0x18);
    if (*(int *)(puVar11 + lVar7 + -0x10) == 1) {
      *(uint8_t **)(puVar1 + lVar14) =
           codeExecutablePointer +
           *(long *)(puVar11 + lVar7) +
           ((*(long *)(puVar11 + lVar7 + -8) + lVar13) - (long)(baseAddress + lVar14));
    }
    else if (*(int *)(puVar11 + lVar7 + -0x10) == 0) {
      *(int *)(puVar1 + lVar14) =
           (int)(codeExecutablePointer +
                *(long *)(puVar11 + lVar7) +
                ((*(long *)(puVar11 + lVar7 + -8) + lVar13) - (long)(baseAddress + lVar14)));
    }
    lVar7 = lVar7 + 0x20;
  }
  lVar14 = (sVar2 + 0xf & 0xfffffffffffffff0) + lVar9;
  lVar7 = (sVar3 + 0xf & 0xfffffffffffffff0) + lVar14;
  lVar15 = (sVar4 + 0xf & 0xfffffffffffffff0) + lVar7;
  lVar13 = (sVar5 + 0xf & 0xfffffffffffffff0) + lVar15;
  memcpy(codeWriteablePointer + lVar8,(jit->unwindInfo).data,(jit->unwindInfo).size);
  puVar11 = codeExecutablePointer + lVar6;
  ehFrameZoneExecutablePointer = puVar11;
  memcpy(codeWriteablePointer + lVar6,(jit->dwarfEhBuilder).buffer.data,
         (jit->dwarfEhBuilder).buffer.size);
  sysbvm_dwarf_debugInfo_patchTextAddressesRelativeTo
            (&jit->dwarfDebugInfoBuilder,(uintptr_t)baseAddress);
  memcpy(codeWriteablePointer + lVar9,(jit->dwarfDebugInfoBuilder).line.data,
         (jit->dwarfDebugInfoBuilder).line.size);
  memcpy(codeWriteablePointer + lVar14,(jit->dwarfDebugInfoBuilder).str.data,
         (jit->dwarfDebugInfoBuilder).str.size);
  memcpy(codeWriteablePointer + lVar7,(jit->dwarfDebugInfoBuilder).abbrev.data,
         (jit->dwarfDebugInfoBuilder).abbrev.size);
  memcpy(codeWriteablePointer + lVar15,(jit->dwarfDebugInfoBuilder).info.data,
         (jit->dwarfDebugInfoBuilder).info.size);
  puVar1 = codeWriteablePointer + lVar13;
  memcpy(puVar1,(jit->objectFileContent).data,(jit->objectFileContent).size);
  sVar2 = (jit->objectFileContent).size;
  sVar3 = (jit->dwarfEhBuilder).fdeInitialLocationOffset;
  if (sVar3 != 0) {
    *(int *)(codeWriteablePointer + lVar6 + sVar3) = ((int)baseAddress - (int)puVar11) - (int)sVar3;
  }
  *(uint8_t **)(codeWriteablePointer + 0x28) =
       puVar1 + (sVar2 - (long)codeWriteablePointer) + -0x280;
  *(ulong *)(puVar1 + (sVar2 - 0x228)) = uVar12;
  *(uint8_t **)(puVar1 + (sVar2 - 0x230)) = baseAddress;
  *(size_t *)(puVar1 + (sVar2 - 0x220)) = (jit->instructions).size;
  *(long *)(puVar1 + (sVar2 - 0x1e8)) = lVar6;
  *(uint8_t **)(puVar1 + (sVar2 - 0x1f0)) = puVar11;
  sVar3 = (jit->dwarfEhBuilder).buffer.size;
  *(size_t *)(puVar1 + (sVar2 - 0x1e0)) = sVar3;
  *(long *)(puVar1 + (sVar2 - 0x1a8)) = lVar9;
  *(size_t *)(puVar1 + (sVar2 - 0x1a0)) = (jit->dwarfDebugInfoBuilder).line.size;
  *(long *)(puVar1 + (sVar2 - 0x168)) = lVar14;
  *(size_t *)(puVar1 + (sVar2 - 0x160)) = (jit->dwarfDebugInfoBuilder).str.size;
  *(long *)(puVar1 + (sVar2 - 0x128)) = lVar7;
  *(size_t *)(puVar1 + (sVar2 - 0x120)) = (jit->dwarfDebugInfoBuilder).abbrev.size;
  *(long *)(puVar1 + (sVar2 - 0xe8)) = lVar15;
  *(size_t *)(puVar1 + (sVar2 - 0xe0)) = (jit->dwarfDebugInfoBuilder).info.size;
  *(long *)(puVar1 + (sVar2 - 0xa8)) = *(long *)(puVar1 + (sVar2 - 0xa8)) + lVar13;
  *(long *)(puVar1 + (sVar2 - 0x68)) = *(long *)(puVar1 + (sVar2 - 0x68)) + lVar13;
  *(long *)(puVar1 + (sVar2 - 0x28)) = *(long *)(puVar1 + (sVar2 - 0x28)) + lVar13;
  if (sVar3 != 0) {
    sysbvm_dynarray_add(&jit->context->jittedRegisteredFrames,&ehFrameZoneExecutablePointer);
    __register_frame(ehFrameZoneExecutablePointer);
  }
  return baseAddress;
}

Assistant:

SYSBVM_API uint8_t *sysbvm_jit_installIn(sysbvm_bytecodeJit_t *jit, uint8_t *codeWriteablePointer, uint8_t *codeExecutablePointer)
{
    size_t objectFileHeaderOffset = 0;
    size_t codeOffset = sysbvm_sizeAlignedTo(jit->objectFileHeader.size, 16);
    size_t constantsOffset = codeOffset + sysbvm_sizeAlignedTo(jit->instructions.size, 16);

    size_t unwindInfoOffset = constantsOffset + sysbvm_sizeAlignedTo(jit->constants.size, 16);
    size_t ehFrameOffset = unwindInfoOffset + sysbvm_sizeAlignedTo(jit->unwindInfo.size, 16);
    size_t debugLineOffset = ehFrameOffset + sysbvm_sizeAlignedTo(jit->dwarfEhBuilder.buffer.size, 16);
    size_t debugStrOffset = debugLineOffset + sysbvm_sizeAlignedTo(jit->dwarfDebugInfoBuilder.line.size, 16);
    size_t debugAbbrevOffset = debugStrOffset + sysbvm_sizeAlignedTo(jit->dwarfDebugInfoBuilder.str.size, 16);
    size_t debugInfoOffset = debugAbbrevOffset + sysbvm_sizeAlignedTo(jit->dwarfDebugInfoBuilder.abbrev.size, 16);

    size_t objectFileContentOffset = debugInfoOffset + sysbvm_sizeAlignedTo(jit->dwarfDebugInfoBuilder.info.size, 16);

    uint8_t *objectFileHeaderPointer = codeWriteablePointer + objectFileHeaderOffset;
    uint8_t *objectFileHeaderExecutablePointer = codeExecutablePointer + objectFileHeaderOffset;
    memcpy(objectFileHeaderPointer, jit->objectFileHeader.data, jit->objectFileHeader.size);

    uint8_t *instructionsPointers = codeWriteablePointer + codeOffset;
    uint8_t *instructionsExecutablePointers = codeExecutablePointer + codeOffset;
    memcpy(instructionsPointers, jit->instructions.data, jit->instructions.size);

    uint8_t *constantZonePointer = codeWriteablePointer + constantsOffset;
    uint8_t *constantZoneExecutablePointer = codeExecutablePointer + constantsOffset;
    memcpy(constantZonePointer, jit->constants.data, jit->constants.size);

    for(size_t i = 0; i < jit->relocations.size; ++i)
    {
        sysbvm_bytecodeJitRelocation_t *relocation = sysbvm_dynarray_entryOfTypeAt(jit->relocations, sysbvm_bytecodeJitRelocation_t, i);
        uint8_t *relocationTarget = instructionsPointers + relocation->offset;
        uint8_t *relocationExecutableTarget = instructionsExecutablePointers + relocation->offset;
        intptr_t relocationTargetAddress = (intptr_t)relocationExecutableTarget;

        intptr_t relativeValue = (intptr_t)constantZoneExecutablePointer + relocation->value - relocationTargetAddress + relocation->addend;
        switch(relocation->type)
        {
        case SYSBVM_BYTECODE_JIT_RELOCATION_RELATIVE32:
            *((int32_t*)relocationTarget) = (int32_t)relativeValue;
            break;
        case SYSBVM_BYTECODE_JIT_RELOCATION_RELATIVE64:
            *((int64_t*)relocationTarget) = (int64_t)relativeValue;
            break;
        }
    }

    uint8_t *unwindInfoZonePointer = codeWriteablePointer + unwindInfoOffset;
    uint8_t *unwindInfoZoneExecutablePointer = codeExecutablePointer + unwindInfoOffset;
    memcpy(unwindInfoZonePointer, jit->unwindInfo.data, jit->unwindInfo.size);

    uint8_t *ehFrameZonePointer = codeWriteablePointer + ehFrameOffset;
    uint8_t *ehFrameZoneExecutablePointer = codeExecutablePointer + ehFrameOffset;
    memcpy(ehFrameZonePointer, jit->dwarfEhBuilder.buffer.data, jit->dwarfEhBuilder.buffer.size);

    sysbvm_dwarf_debugInfo_patchTextAddressesRelativeTo(&jit->dwarfDebugInfoBuilder, (uintptr_t)instructionsExecutablePointers);

    uint8_t *debugLineZonePointer = codeWriteablePointer + debugLineOffset;
    uint8_t *debugLineZoneExecutablePointer = codeExecutablePointer + debugLineOffset;
    memcpy(debugLineZonePointer, jit->dwarfDebugInfoBuilder.line.data, jit->dwarfDebugInfoBuilder.line.size);

    uint8_t *debugStrZonePointer = codeWriteablePointer + debugStrOffset;
    uint8_t *debugStrZoneExecutablePointer = codeExecutablePointer + debugStrOffset;
    memcpy(debugStrZonePointer, jit->dwarfDebugInfoBuilder.str.data, jit->dwarfDebugInfoBuilder.str.size);

    uint8_t *debugAbbrevZonePointer = codeWriteablePointer + debugAbbrevOffset;
    uint8_t *debugAbbrevZoneExecutablePointer = codeExecutablePointer + debugAbbrevOffset;
    memcpy(debugAbbrevZonePointer, jit->dwarfDebugInfoBuilder.abbrev.data, jit->dwarfDebugInfoBuilder.abbrev.size);

    uint8_t *debugInfoZonePointer = codeWriteablePointer + debugInfoOffset;
    uint8_t *debugInfoZoneExecutablePointer = codeExecutablePointer + debugInfoOffset;
    memcpy(debugInfoZonePointer, jit->dwarfDebugInfoBuilder.info.data, jit->dwarfDebugInfoBuilder.info.size);

    uint8_t *objectFileContentPointer = codeWriteablePointer + objectFileContentOffset;
    uint8_t *objectFileContentExecutablePointer = codeExecutablePointer + objectFileContentOffset;
    memcpy(objectFileContentPointer, jit->objectFileContent.data, jit->objectFileContent.size);

    sysbvm_jit_fixupObjectFile(jit,
        (sysbvm_elf64_header_t*)objectFileHeaderPointer,
        (sysbvm_elf64_header_t*)objectFileHeaderExecutablePointer,
        instructionsExecutablePointers,
        ehFrameZonePointer, ehFrameZoneExecutablePointer,
        debugLineZoneExecutablePointer,
        debugStrZoneExecutablePointer,
        debugAbbrevZoneExecutablePointer,
        debugInfoZoneExecutablePointer,
        objectFileContentExecutablePointer,
        (sysbvm_jit_x64_elfContentFooter_t*) (objectFileContentPointer + jit->objectFileContent.size - sizeof(sysbvm_jit_x64_elfContentFooter_t))
    );

    sysbvm_jit_emitPerfSymbolFor(jit, instructionsPointers);

#ifdef _WIN32
    RUNTIME_FUNCTION *runtimeFunction = (RUNTIME_FUNCTION*)unwindInfoZoneExecutablePointer;
    runtimeFunction->UnwindInfoAddress = (DWORD)(sizeof(RUNTIME_FUNCTION) + unwindInfoZoneExecutablePointer - instructionsExecutablePointers);
    if(RtlAddFunctionTable(runtimeFunction, 1, (DWORD64)(uintptr_t)instructionsExecutablePointers))
    {
        // Store the handle in the context for cleanup.
    }
#else
    (void)unwindInfoZoneExecutablePointer;
    if(jit->dwarfEhBuilder.buffer.size > 0)
    {
#   ifdef __APPLE__
        // It takes the FDE parameter
        if(jit->dwarfEhBuilder.fdeOffset > 0)
        {
            void *fdePointer = ehFrameZoneExecutablePointer + jit->dwarfEhBuilder.fdeOffset;
            sysbvm_dynarray_add(&jit->context->jittedRegisteredFrames, &fdePointer);
            __register_frame(fdePointer);
        }
#   else
        // Send the eh_frame section.
        sysbvm_dynarray_add(&jit->context->jittedRegisteredFrames, &ehFrameZoneExecutablePointer);
        __register_frame(ehFrameZoneExecutablePointer);
#   endif
    }
#endif

    return instructionsExecutablePointers;
}